

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateExternalFunction
          (JavascriptLibrary *this,ExternalMethod entryPoint,Var nameId,Var signature,UINT64 flags,
          bool isLengthAvailable)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  JavascriptExternalFunction *this_01;
  undefined4 *puVar3;
  PropertyRecord *pPVar4;
  undefined3 in_register_00000089;
  
  this_01 = CreateIdMappedExternalFunction<void*(*)(Js::RecyclableObject*,Js::CallInfo,void**)>
                      (this,(_func_void_ptr_RecyclableObject_ptr_CallInfo_void_ptr_ptr *)entryPoint,
                       (&this->externalFunctionWithDeferredPrototypeType)
                       [CONCAT31(in_register_00000089,isLengthAvailable)].ptr);
  this_01->flags = flags;
  RuntimeFunction::SetFunctionNameId(&this_01->super_RuntimeFunction,nameId);
  Memory::Recycler::WBSetBit((char *)&this_01->signature);
  (this_01->signature).ptr = signature;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this_01->signature);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015b6718,HostPhase);
  if (!bVar2) {
    return this_01;
  }
  if (((ulong)nameId & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)nameId & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)nameId & 0xffff000000000000) != 0x1000000000000) {
      pPVar4 = (PropertyRecord *)JavascriptString::GetString((JavascriptString *)nameId);
      goto LAB_00bee03c;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00bee065;
    *puVar3 = 0;
  }
  this_00 = ((this->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if (((ulong)nameId & 0x1ffff00000000) != 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
LAB_00bee065:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pPVar4 = ThreadContext::GetPropertyName(this_00,(PropertyId)nameId);
  pPVar4 = pPVar4 + 1;
LAB_00bee03c:
  Output::Print(L"Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"
                ,this,nameId,pPVar4);
  return this_01;
}

Assistant:

JavascriptExternalFunction*
    JavascriptLibrary::CreateExternalFunction(ExternalMethod entryPoint, Var nameId, Var signature, UINT64 flags, bool isLengthAvailable)
    {
        JavascriptExternalFunction* function = this->CreateIdMappedExternalFunction(entryPoint, isLengthAvailable ? externalFunctionWithLengthAndDeferredPrototypeType : externalFunctionWithDeferredPrototypeType);
        function->SetExternalFlags(flags);
        function->SetFunctionNameId(nameId);
        function->SetSignature(signature);
#ifdef HEAP_ENUMERATION_VALIDATION
        function->SetHeapEnumValidationCookie(HEAP_ENUMERATION_LIBRARY_OBJECT_COOKIE);
#endif

        JS_ETW_INTERNAL(EventWriteJSCRIPT_BUILD_DIRECT_FUNCTION(scriptContext, function, TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString()));
#if DBG_DUMP
        if (Js::Configuration::Global.flags.Trace.IsEnabled(Js::HostPhase))
        {
            Output::Print(_u("Create new external function: methodAddr= %p, propertyRecord= %p, propertyName= %s\n"),
                this, nameId,
                TaggedInt::Is(nameId) ? scriptContext->GetThreadContext()->GetPropertyName(TaggedInt::ToInt32(nameId))->GetBuffer() : ((JavascriptString *)nameId)->GetString());
        }
#endif
        return function;
    }